

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall ON_DimStyle::SetMaskBorder(ON_DimStyle *this,double border)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  ON_TextMask text_mask;
  ON_TextMask local_38;
  undefined4 uVar4;
  undefined3 uVar6;
  undefined2 uVar8;
  
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  local_38.m_content_hash.m_digest._12_4_ = SUB84(uVar1,0);
  local_38.m_content_hash.m_digest._16_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  local_38.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  local_38.m_mask_type = (this->m_text_mask).m_mask_type;
  local_38.m_mask_frame = (this->m_text_mask).m_mask_frame;
  local_38.m_reserved2 = (this->m_text_mask).m_reserved2;
  local_38.m_mask_color.field_0 = (this->m_text_mask).m_mask_color.field_0;
  local_38.m_mask_border = (this->m_text_mask).m_mask_border;
  uVar2 = (this->m_text_mask).m_reserved3;
  uVar3 = (this->m_text_mask).m_content_hash.m_digest[0];
  uVar5 = (this->m_text_mask).m_content_hash.m_digest[1];
  uVar7 = (this->m_text_mask).m_content_hash.m_digest[2];
  uVar9 = (this->m_text_mask).m_content_hash.m_digest[3];
  uVar8 = CONCAT11(uVar9,uVar7);
  uVar6 = CONCAT21(uVar8,uVar5);
  uVar4 = CONCAT31(uVar6,uVar3);
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  local_38.m_content_hash.m_digest._4_4_ = SUB84(uVar1,0);
  local_38.m_content_hash.m_digest._8_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  local_38.m_content_hash.m_digest._0_4_ = uVar4;
  if (0.0 <= border) {
    if ((local_38.m_mask_border != border) || (NAN(local_38.m_mask_border) || NAN(border))) {
      local_38.m_content_hash.m_digest._0_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
      local_38.m_content_hash.m_digest._4_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
      local_38.m_content_hash.m_digest._8_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
      local_38.m_content_hash.m_digest._12_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
      local_38.m_content_hash.m_digest._16_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      local_38.m_mask_border = border;
    }
  }
  local_38.m_reserved3 = uVar2;
  Internal_SetTextMask(this,&local_38);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskBorder);
  return;
}

Assistant:

void ON_DimStyle::SetMaskBorder(double border)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskBorder(border);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskBorder);
}